

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

void __thiscall unodb::qsbr_per_thread::~qsbr_per_thread(qsbr_per_thread *this)

{
  if (this->paused == false) {
    qsbr_pause(this);
  }
  std::
  _Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_false>_>
  ::~_Hashtable(&(this->active_ptrs)._M_h);
  std::
  vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ::~vector(&this->current_interval_dealloc_requests);
  std::
  vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ::~vector(&this->previous_interval_dealloc_requests);
  std::
  unique_ptr<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ::~unique_ptr(&this->current_interval_orphan_list_node);
  std::
  unique_ptr<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ::~unique_ptr(&this->previous_interval_orphan_list_node);
  return;
}

Assistant:

~qsbr_per_thread() noexcept {
    if (!is_qsbr_paused()) {
#ifdef UNODB_DETAIL_WITH_STATS
      // TODO(laurynas): to avoid try/catch below:
      // - replace std::mutex with noexcept synchronization, realistically only
      // spinlock fits, which might not be good enough;
      // - replace Boost.Accumulator with own noexcept stats.
      try {
        qsbr_pause();
      }
      // The QSBR destructor can only throw std::system_error from the stats
      // mutex lock. Eat this exception, and eat any other unexpected exceptions
      // too, except for the debug build.
      // LCOV_EXCL_START
      catch (const std::system_error &e) {
        std::cerr << "Failed to register QSBR stats for the quitting thread: "
                  << e.what() << '\n';
      } catch (const std::exception &e) {
        std::cerr << "Unknown exception in the QSBR thread destructor: "
                  << e.what() << '\n';
        UNODB_DETAIL_DEBUG_CRASH();
      } catch (...) {
        std::cerr << "Unknown exception in the QSBR thread destructor";
        UNODB_DETAIL_DEBUG_CRASH();
      }
#else
      qsbr_pause();
#endif
      // LCOV_EXCL_STOP
    }
  }